

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O1

void __thiscall
fill<128U,_91U,_buffer_layout_bfs>::operator()
          (fill<128U,_91U,_buffer_layout_bfs> *this,array<Stream,_128UL> *streams,uchar **buffer,
          array<unsigned_long,_128UL> *buffer_count)

{
  size_t sVar1;
  uchar *puVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  uchar **ppuVar6;
  long lVar7;
  ulong n0;
  uchar *puVar8;
  uchar **ppuVar9;
  size_t sVar10;
  uchar **ppuVar11;
  DI __d;
  size_t local_58;
  size_t local_40;
  DI local_38;
  
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"fill_leaf",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", leaf,  I=",0xb);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  local_38.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  if (buffer_count->_M_elems[0x5b] != 0) {
    __assert_fail("buffer_count[I] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                  ,0x13b,
                  "void fill_leaf(std::array<Stream, K> &__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict, std::true_type) [K = 128U, I = 91U, BufferLayout = buffer_layout_bfs]"
                 );
  }
  sVar10 = streams->_M_elems[0x36].n;
  sVar1 = streams->_M_elems[0x37].n;
  n0 = sVar1 + sVar10;
  if (n0 < 0x17) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"need=",5);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Ln=",5);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Rn=",5);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    lVar7 = -n0;
    if (streams->_M_elems[0x36].n == 0) {
      lVar5 = 0x17;
LAB_00176650:
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"left drained, Ln=",0x11);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Rn=",5);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      sVar10 = streams->_M_elems[0x37].n;
      if (sVar10 != 0) {
        memcpy(buffer + lVar7 + (0x603b - lVar5),streams->_M_elems[0x37].stream,sVar10 << 3);
      }
      streams->_M_elems[0x37].n = 0;
      buffer_count->_M_elems[0x5b] = n0;
    }
    else {
      if (streams->_M_elems[0x37].n != 0) {
        ppuVar6 = streams->_M_elems[0x36].stream;
        puVar8 = *ppuVar6;
        if (puVar8 != (uchar *)0x0) {
          local_58 = streams->_M_elems[0x36].n;
          ppuVar9 = streams->_M_elems[0x37].stream;
          local_40 = streams->_M_elems[0x37].n;
          ppuVar11 = buffer + lVar7 + 0x6024;
          lVar5 = 0x16;
          do {
            puVar2 = *ppuVar9;
            if (puVar2 == (uchar *)0x0) goto LAB_001768fa;
            iVar3 = strcmp((char *)puVar8,(char *)puVar2);
            if (iVar3 < 1) {
              *ppuVar11 = puVar8;
              ppuVar6 = ppuVar6 + 1;
              streams->_M_elems[0x36].stream = ppuVar6;
              local_58 = local_58 - 1;
              streams->_M_elems[0x36].n = local_58;
              if (local_58 == 0) goto LAB_00176650;
            }
            else {
              *ppuVar11 = puVar2;
              ppuVar9 = ppuVar9 + 1;
              streams->_M_elems[0x37].stream = ppuVar9;
              local_40 = local_40 - 1;
              streams->_M_elems[0x37].n = local_40;
              if (local_40 == 0) goto LAB_00176560;
            }
            puVar8 = *ppuVar6;
            ppuVar11 = ppuVar11 + 1;
            lVar5 = lVar5 + -1;
          } while (puVar8 != (uchar *)0x0);
        }
LAB_0017638c:
        __assert_fail("a != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
      }
      lVar5 = 0x17;
LAB_00176560:
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"right drained, Ln=",0x12);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Rn=",5);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      sVar10 = streams->_M_elems[0x36].n;
      if (sVar10 != 0) {
        memcpy(buffer + lVar7 + 0x6024 + (0x17 - lVar5),streams->_M_elems[0x36].stream,sVar10 << 3);
      }
      streams->_M_elems[0x36].n = 0;
      buffer_count->_M_elems[0x5b] = n0;
      check_input(buffer + lVar7 + 0x6024,n0);
    }
    goto LAB_001768e1;
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"need=",5);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Ln=",5);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Rn=",5);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if (sVar10 == 0) {
    lVar7 = 0x17;
LAB_00176801:
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"left drained, Ln=",0x11);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Rn=",5);
    sVar10 = streams->_M_elems[0x37].n;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    ppuVar6 = streams->_M_elems[0x37].stream;
    if (lVar7 != 0) {
      memcpy(buffer + (0x6024 - lVar7),ppuVar6,lVar7 * 8);
    }
    streams->_M_elems[0x37].n = sVar10 - lVar7;
    streams->_M_elems[0x37].stream = ppuVar6 + lVar7;
LAB_001768c0:
    buffer_count->_M_elems[0x5b] = 0x17;
  }
  else {
    if (sVar1 == 0) {
      lVar7 = 0x17;
LAB_0017672b:
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"right drained, Ln=",0x12);
      sVar10 = streams->_M_elems[0x36].n;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Rn=",5);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      ppuVar6 = streams->_M_elems[0x36].stream;
      if (lVar7 != 0) {
        memcpy(buffer + (0x6024 - lVar7),ppuVar6,lVar7 * 8);
      }
      streams->_M_elems[0x36].n = sVar10 - lVar7;
      streams->_M_elems[0x36].stream = ppuVar6 + lVar7;
      goto LAB_001768c0;
    }
    ppuVar6 = streams->_M_elems[0x36].stream;
    local_58 = streams->_M_elems[0x36].n;
    ppuVar9 = streams->_M_elems[0x37].stream;
    sVar10 = streams->_M_elems[0x37].n;
    lVar7 = 0;
    do {
      puVar8 = *ppuVar6;
      if (puVar8 == (uchar *)0x0) goto LAB_0017638c;
      puVar2 = *ppuVar9;
      if (puVar2 == (uchar *)0x0) {
LAB_001768fa:
        __assert_fail("b != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
      }
      iVar3 = strcmp((char *)puVar8,(char *)puVar2);
      if (iVar3 < 1) {
        buffer[lVar7 + 0x600d] = puVar8;
        ppuVar6 = ppuVar6 + 1;
        streams->_M_elems[0x36].stream = ppuVar6;
        local_58 = local_58 - 1;
        streams->_M_elems[0x36].n = local_58;
        if (local_58 == 0) {
          lVar7 = 0x16 - lVar7;
          goto LAB_00176801;
        }
      }
      else {
        buffer[lVar7 + 0x600d] = puVar2;
        ppuVar9 = ppuVar9 + 1;
        streams->_M_elems[0x37].stream = ppuVar9;
        sVar10 = sVar10 - 1;
        streams->_M_elems[0x37].n = sVar10;
        if (sVar10 == 0) {
          lVar7 = 0x16 - lVar7;
          goto LAB_0017672b;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x17);
    buffer_count->_M_elems[0x5b] = 0x17;
  }
  check_input(buffer + 0x600d,0x17);
LAB_001768e1:
  anon_func::DI::~DI(&local_38);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}